

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

int32_t icu_63::number::impl::SimpleModifier::formatTwoArgPattern
                  (SimpleFormatter *compiled,NumberStringBuilder *result,int32_t index,
                  int32_t *outPrefixLength,int32_t *outSuffixLength,Field field,UErrorCode *status)

{
  UnicodeString *this;
  short sVar1;
  char16_t cVar2;
  int iVar3;
  int iVar4;
  char16_t *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int32_t offset;
  int start;
  
  this = &compiled->compiledPattern;
  pcVar5 = UnicodeString::getBuffer(this);
  sVar1 = (compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (compiled->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  if ((iVar7 == 0) || (*pcVar5 != L'\x02')) {
    *status = U_INTERNAL_PROGRAM_ERROR;
    iVar7 = 0;
  }
  else {
    cVar2 = UnicodeString::doCharAt(this,1);
    if ((ushort)cVar2 < 0x100) {
      iVar3 = 0;
      offset = 2;
    }
    else {
      iVar3 = (ushort)cVar2 - 0x100;
      NumberStringBuilder::insert(result,index,this,2,(ushort)cVar2 - 0xfe,field,status);
      offset = (ushort)cVar2 - 0xfd;
    }
    cVar2 = UnicodeString::doCharAt(this,offset);
    start = offset + 1;
    iVar7 = iVar3;
    if (0xff < (ushort)cVar2) {
      NumberStringBuilder::insert
                (result,iVar3 + index,this,start,((ushort)cVar2 - 0x100) + start,field,status);
      start = start + (uint)(ushort)cVar2 + -0xff;
      iVar7 = iVar3 + (uint)(ushort)cVar2 + -0x100;
    }
    sVar1 = (compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (compiled->compiledPattern).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    iVar6 = 0;
    if (start != iVar4) {
      cVar2 = UnicodeString::doCharAt(this,start);
      uVar8 = (uint)(ushort)cVar2;
      iVar6 = uVar8 - 0x100;
      NumberStringBuilder::insert
                (result,index + iVar7,this,start + 1,start + uVar8 + -0xff,field,status);
      iVar7 = iVar7 + uVar8 + -0x100;
    }
    *outPrefixLength = iVar3;
    *outSuffixLength = iVar6;
  }
  return iVar7;
}

Assistant:

int32_t
SimpleModifier::formatTwoArgPattern(const SimpleFormatter& compiled, NumberStringBuilder& result,
                                    int32_t index, int32_t* outPrefixLength, int32_t* outSuffixLength,
                                    Field field, UErrorCode& status) {
    const UnicodeString& compiledPattern = compiled.compiledPattern;
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            compiledPattern.getBuffer(), compiledPattern.length());
    if (argLimit != 2) {
        status = U_INTERNAL_PROGRAM_ERROR;
        return 0;
    }
    int32_t offset = 1; // offset into compiledPattern
    int32_t length = 0; // chars added to result

    int32_t prefixLength = compiledPattern.charAt(offset);
    offset++;
    if (prefixLength < ARG_NUM_LIMIT) {
        // No prefix
        prefixLength = 0;
    } else {
        prefixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + prefixLength, field, status);
        offset += prefixLength;
        length += prefixLength;
        offset++;
    }

    int32_t infixLength = compiledPattern.charAt(offset);
    offset++;
    if (infixLength < ARG_NUM_LIMIT) {
        // No infix
        infixLength = 0;
    } else {
        infixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + infixLength, field, status);
        offset += infixLength;
        length += infixLength;
        offset++;
    }

    int32_t suffixLength;
    if (offset == compiledPattern.length()) {
        // No suffix
        suffixLength = 0;
    } else {
        suffixLength = compiledPattern.charAt(offset) -  ARG_NUM_LIMIT;
        offset++;
        result.insert(index + length, compiledPattern, offset, offset + suffixLength, field, status);
        length += suffixLength;
    }

    *outPrefixLength = prefixLength;
    *outSuffixLength = suffixLength;

    return length;
}